

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool ON_IsOrthogonalFrame(ON_2dVector *X,ON_2dVector *Y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  dVar2 = ON_2dVector::Length(X);
  dVar3 = ON_2dVector::Length(Y);
  bVar1 = false;
  if ((1.490116119385e-08 < dVar2) && (bVar1 = false, 1.490116119385e-08 < dVar3)) {
    auVar4._8_8_ = dVar2;
    auVar4._0_8_ = dVar3;
    auVar4 = divpd(_DAT_006909c0,auVar4);
    bVar1 = ABS(auVar4._8_8_ * (X->x * Y->x + X->y * Y->y) * auVar4._0_8_) <= 1.490116119385e-08;
  }
  return bVar1;
}

Assistant:

bool ON_IsOrthogonalFrame( const ON_2dVector& X,  const ON_2dVector& Y )
{
  // returns true if X, Y, Z is an orthogonal frame
  double lx = X.Length();
  double ly = Y.Length();
  if ( lx <=  ON_SQRT_EPSILON )
    return false;
  if ( ly <=  ON_SQRT_EPSILON )
    return false;
  lx = 1.0/lx;
  ly = 1.0/ly;
  double x = ON_DotProduct( X, Y )*lx*ly;
  if ( fabs(x) >  ON_SQRT_EPSILON )
    return false;
  return true;
}